

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O0

ssize_t __thiscall DomLayoutFunction::write(DomLayoutFunction *this,int __fd,void *__buf,size_t __n)

{
  bool bVar1;
  undefined4 in_register_00000034;
  QString *pQVar2;
  long in_FS_OFFSET;
  char16_t *str;
  DomLayoutFunction *in_stack_fffffffffffffeb8;
  QArrayDataPointer<char16_t> *in_stack_fffffffffffffec0;
  QString *in_stack_fffffffffffffec8;
  QString *str_00;
  QAnyStringView *local_a8;
  QAnyStringView *local_58;
  QArrayDataPointer<char16_t> local_48 [2];
  long local_8;
  
  pQVar2 = (QString *)CONCAT44(in_register_00000034,__fd);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  str_00 = pQVar2;
  bVar1 = QString::isEmpty((QString *)0x1a1e89);
  if (bVar1) {
    QArrayDataPointer<char16_t>::QArrayDataPointer(local_48,(Data *)0x0,L"layoutfunction",0xe);
    QString::QString((QString *)in_stack_fffffffffffffec0,(DataPointer *)in_stack_fffffffffffffeb8);
  }
  else {
    QString::toLower(&in_stack_fffffffffffffeb8->m_attr_spacing);
  }
  QAnyStringView::QAnyStringView((QAnyStringView *)this,in_stack_fffffffffffffec8);
  QXmlStreamWriter::writeStartElement((QAnyStringView *)str_00);
  QString::~QString((QString *)0x1a1f3c);
  if (bVar1) {
    QArrayDataPointer<char16_t>::~QArrayDataPointer(in_stack_fffffffffffffec0);
  }
  bVar1 = hasAttributeSpacing(this);
  if (bVar1) {
    in_stack_fffffffffffffec8 = pQVar2;
    Qt::Literals::StringLiterals::operator____s((char16_t *)str_00,(size_t)this);
    QAnyStringView::QAnyStringView((QAnyStringView *)this,in_stack_fffffffffffffec8);
    attributeSpacing(in_stack_fffffffffffffeb8);
    QAnyStringView::QAnyStringView((QAnyStringView *)this,in_stack_fffffffffffffec8);
    QXmlStreamWriter::writeAttribute((QAnyStringView *)in_stack_fffffffffffffec8,local_58);
    QString::~QString((QString *)0x1a1ffb);
    QString::~QString((QString *)0x1a2008);
  }
  bVar1 = hasAttributeMargin(this);
  if (bVar1) {
    Qt::Literals::StringLiterals::operator____s((char16_t *)str_00,(size_t)this);
    QAnyStringView::QAnyStringView((QAnyStringView *)this,in_stack_fffffffffffffec8);
    attributeMargin(in_stack_fffffffffffffeb8);
    QAnyStringView::QAnyStringView((QAnyStringView *)this,in_stack_fffffffffffffec8);
    QXmlStreamWriter::writeAttribute((QAnyStringView *)pQVar2,local_a8);
    QString::~QString((QString *)0x1a20a2);
    QString::~QString((QString *)0x1a20af);
  }
  QXmlStreamWriter::writeEndElement();
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return *(long *)(in_FS_OFFSET + 0x28);
}

Assistant:

void DomLayoutFunction::write(QXmlStreamWriter &writer, const QString &tagName) const
{
    writer.writeStartElement(tagName.isEmpty() ? QStringLiteral("layoutfunction") : tagName.toLower());

    if (hasAttributeSpacing())
        writer.writeAttribute(u"spacing"_s, attributeSpacing());

    if (hasAttributeMargin())
        writer.writeAttribute(u"margin"_s, attributeMargin());

    writer.writeEndElement();
}